

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

float gimage::getMutualInformationU8
                (ImageFloat *mi,ImageU8 *image1,ImageU8 *image2,ImageFloat *disp,int channel)

{
  float ***pppfVar1;
  uchar ***pppuVar2;
  uchar ***pppuVar3;
  long lVar4;
  long k_1;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long k;
  long i;
  long lVar11;
  float *pfVar12;
  long i_1;
  bool bVar13;
  float sum;
  float fVar14;
  float fVar15;
  double local_150;
  double local_148;
  double local_140;
  GaussKernel gk;
  ImageFloat P;
  ImageFloat Pg1;
  ImageFloat P1;
  ImageFloat Pg;
  
  Image<float,_gimage::PixelTraits<float>_>::Image(&P,0x100,0x100,1);
  Image<float,_gimage::PixelTraits<float>_>::operator=(&P,0.0);
  lVar5 = disp->width;
  if ((lVar5 < 1) || (lVar7 = disp->height, lVar7 < 1)) {
    lVar5 = image1->width;
    if (image2->width < image1->width) {
      lVar5 = image2->width;
    }
    lVar7 = image1->height;
    if (image2->height < image1->height) {
      lVar7 = image2->height;
    }
    iVar10 = 0;
    lVar4 = 0;
    if (0 < lVar5) {
      lVar4 = lVar5;
    }
    lVar8 = 0;
    if (0 < lVar7) {
      lVar8 = lVar7;
    }
    if (P.depth < 1) {
      P.depth = 0;
    }
    for (; iVar10 != P.depth; iVar10 = iVar10 + 1) {
      for (lVar6 = 0; lVar6 != lVar8; lVar6 = lVar6 + 1) {
        pppuVar2 = image1->img;
        pppuVar3 = image2->img;
        lVar9 = 0;
        lVar11 = lVar4;
        while (bVar13 = lVar11 != 0, lVar11 = lVar11 + -1, bVar13) {
          (*P.img)[pppuVar3[channel][(int)lVar6][lVar9 >> 0x20]]
          [pppuVar2[channel][(int)lVar6][lVar9 >> 0x20]] =
               (*P.img)[pppuVar3[channel][(int)lVar6][lVar9 >> 0x20]]
               [pppuVar2[channel][(int)lVar6][lVar9 >> 0x20]] + 1.0;
          lVar9 = lVar9 + 0x100000000;
        }
      }
    }
    fVar15 = 1.0 / (float)(lVar7 * lVar5);
    operator*=(&P,(double)fVar15);
  }
  else {
    lVar4 = image1->width;
    if (image2->width < image1->width) {
      lVar4 = image2->width;
    }
    if (lVar5 < lVar4) {
      lVar4 = lVar5;
    }
    lVar5 = image1->height;
    if (image2->height < image1->height) {
      lVar5 = image2->height;
    }
    if (lVar7 < lVar5) {
      lVar5 = lVar7;
    }
    lVar7 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar7;
    }
    if (lVar5 < 1) {
      lVar5 = lVar7;
    }
    lVar8 = 0;
    for (; lVar7 != lVar5; lVar7 = lVar7 + 1) {
      pppfVar1 = disp->img;
      iVar10 = (int)lVar7;
      pppuVar2 = image2->img;
      pppuVar3 = image1->img;
      lVar6 = 0;
      for (lVar11 = 0; lVar4 != lVar11; lVar11 = lVar11 + 1) {
        fVar15 = *(float *)((long)(*pppfVar1)[iVar10] + (lVar6 >> 0x1e));
        if (((uint)ABS(fVar15) < 0x7f800000) && (fVar15 < (float)lVar11)) {
          fVar15 = (float)lVar11 - fVar15;
          fVar15 = fVar15 - (float)(long)fVar15;
          (*P.img)[(int)(((1.0 - fVar15) * (float)pppuVar2[channel][iVar10][lVar6 >> 0x20] +
                         fVar15 * (float)pppuVar2[channel][iVar10][lVar6 >> 0x20]) * 0.5 + 0.5)]
          [pppuVar3[channel][iVar10][lVar6 >> 0x20]] =
               (*P.img)[(int)(((1.0 - fVar15) * (float)pppuVar2[channel][iVar10][lVar6 >> 0x20] +
                              fVar15 * (float)pppuVar2[channel][iVar10][lVar6 >> 0x20]) * 0.5 + 0.5)
                       ][pppuVar3[channel][iVar10][lVar6 >> 0x20]] + 1.0;
          lVar8 = lVar8 + 1;
        }
        lVar6 = lVar6 + 0x100000000;
      }
    }
    fVar15 = 1.0 / (float)lVar8;
    operator*=(&P,(double)fVar15);
  }
  lVar7 = 0;
  lVar5 = P.width;
  if (P.width < 1) {
    lVar5 = lVar7;
  }
  lVar4 = P.height;
  if (P.height < 1) {
    lVar4 = lVar7;
  }
  for (; lVar7 != lVar4; lVar7 = lVar7 + 1) {
    lVar6 = 0;
    lVar8 = lVar5;
    while (bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
      fVar14 = *(float *)((long)(*P.img)[(int)lVar7] + (lVar6 >> 0x1e));
      if ((fVar14 == 0.0) && (!NAN(fVar14))) {
        *(float *)((long)(*P.img)[(int)lVar7] + (lVar6 >> 0x1e)) = fVar15;
      }
      lVar6 = lVar6 + 0x100000000;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::Image(&Pg,0,0,1);
  gauss<float>(&Pg,&P,1.0);
  pfVar12 = **Pg.img;
  local_150 = 0.0;
  for (lVar5 = 0; lVar5 < Pg.height; lVar5 = lVar5 + 1) {
    for (lVar7 = 0; lVar7 < Pg.width; lVar7 = lVar7 + 1) {
      fVar14 = anon_unknown_11::negLog(pfVar12);
      local_150 = local_150 + (double)fVar14;
      pfVar12 = pfVar12 + 1;
    }
  }
  gauss<float>(mi,&Pg,1.0);
  Image<float,_gimage::PixelTraits<float>_>::Image(&P1,P.width,1,1);
  lVar7 = 0;
  lVar5 = P.height;
  if (P.height < 1) {
    lVar5 = lVar7;
  }
  lVar4 = P.width;
  if (P.width < 1) {
    lVar4 = lVar7;
  }
  for (; lVar7 != lVar4; lVar7 = lVar7 + 1) {
    fVar14 = 0.0;
    lVar6 = 0;
    lVar8 = lVar5;
    while (bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
      fVar14 = fVar14 + *(float *)(*(long *)((long)*P.img + (lVar6 >> 0x1d)) + (long)(int)lVar7 * 4)
      ;
      lVar6 = lVar6 + 0x100000000;
    }
    (**P1.img)[(int)lVar7] = fVar14;
  }
  GaussKernel::GaussKernel(&gk,1.0);
  Image<float,_gimage::PixelTraits<float>_>::Image(&Pg1,P.width,1,1);
  lVar5 = 0;
  for (lVar7 = 0; lVar7 < P1.width; lVar7 = lVar7 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>(&gk,&P1,lVar7,0,0);
    *(float *)((long)**Pg1.img + (lVar5 >> 0x1e)) = fVar14;
    lVar5 = lVar5 + 0x100000000;
  }
  pfVar12 = **Pg1.img;
  local_140 = 0.0;
  for (lVar5 = 0; lVar5 < Pg1.width; lVar5 = lVar5 + 1) {
    fVar14 = anon_unknown_11::negLog(pfVar12);
    local_140 = local_140 + (double)fVar14;
    pfVar12 = pfVar12 + 1;
  }
  for (lVar5 = 0; lVar5 < Pg1.width; lVar5 = lVar5 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>(&gk,&Pg1,lVar5,0,0);
    pppfVar1 = mi->img;
    lVar4 = (long)(int)lVar5 * 4;
    lVar7 = P.height;
    if (P.height < 1) {
      lVar7 = 0;
    }
    lVar8 = 0;
    while (bVar13 = lVar7 != 0, lVar7 = lVar7 + -1, bVar13) {
      lVar6 = *(long *)((long)*pppfVar1 + (lVar8 >> 0x1d));
      *(float *)(lVar6 + lVar4) = fVar14 - *(float *)(lVar6 + lVar4);
      lVar8 = lVar8 + 0x100000000;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(&P1,P.height,1,1);
  lVar7 = 0;
  lVar5 = P.width;
  if (P.width < 1) {
    lVar5 = lVar7;
  }
  lVar4 = 0;
  if (0 < P.height) {
    lVar4 = P.height;
  }
  for (; lVar7 != lVar4; lVar7 = lVar7 + 1) {
    fVar14 = 0.0;
    lVar6 = 0;
    lVar8 = lVar5;
    while (bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
      fVar14 = fVar14 + *(float *)(*(long *)((long)*P.img + ((lVar7 << 0x20) >> 0x1d)) +
                                  (lVar6 >> 0x1e));
      lVar6 = lVar6 + 0x100000000;
    }
    *(float *)((long)**P1.img + ((lVar7 << 0x20) >> 0x1e)) = fVar14;
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(&Pg1,P.height,1,1);
  lVar5 = 0;
  for (lVar7 = 0; lVar7 < Pg1.width; lVar7 = lVar7 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>(&gk,&P1,lVar7,0,0);
    *(float *)((long)**Pg1.img + (lVar5 >> 0x1e)) = fVar14;
    lVar5 = lVar5 + 0x100000000;
  }
  pfVar12 = **Pg1.img;
  local_148 = 0.0;
  for (lVar5 = 0; lVar5 < Pg1.width; lVar5 = lVar5 + 1) {
    fVar14 = anon_unknown_11::negLog(pfVar12);
    local_148 = local_148 + (double)fVar14;
    pfVar12 = pfVar12 + 1;
  }
  for (lVar5 = 0; lVar5 < Pg1.width; lVar5 = lVar5 + 1) {
    fVar14 = GaussKernel::convolveHorizontal<float>(&gk,&Pg1,lVar5,0,0);
    pppfVar1 = mi->img;
    lVar7 = P.width;
    if (P.width < 1) {
      lVar7 = 0;
    }
    lVar4 = 0;
    while (bVar13 = lVar7 != 0, lVar7 = lVar7 + -1, bVar13) {
      *(float *)((long)(*pppfVar1)[(int)lVar5] + (lVar4 >> 0x1e)) =
           *(float *)((long)(*pppfVar1)[(int)lVar5] + (lVar4 >> 0x1e)) + fVar14;
      lVar4 = lVar4 + 0x100000000;
    }
  }
  operator*=(mi,(double)fVar15);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&Pg1);
  GaussKernel::~GaussKernel(&gk);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&P1);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&Pg);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&P);
  return (float)((local_140 + local_148) - local_150);
}

Assistant:

float getMutualInformationU8(ImageFloat &mi, const ImageU8 &image1, const ImageU8 &image2,
  const ImageFloat &disp, int channel)
{
  ImageFloat P(256, 256, 1);
  P=0;

  // For computation of mutual information, see Hirschmueller (2008, TPAMI) or
  // Hirschmueller (2005, CVPR).

  // compute joint probabilities P_I1,I2

  float scale; // 1/number_of_correspondences

  if (disp.getWidth() > 0 && disp.getHeight() > 0)
  {
    long width=std::min(std::min(image1.getWidth(), image2.getWidth()), disp.getWidth());
    long height=std::min(std::min(image1.getHeight(), image2.getHeight()), disp.getHeight());
    long n=0;

    for (long k=0; k<height; k++)
    {
      for (long i=0; i<width; i++)
      {
        float v=disp(i, k, 0);

        if (disp.isValidS(v) && v < i)
        {
          v=i-v; // pixel in right image
          long ii=static_cast<long>(v); // full pixel
          v-=ii; // fraction

          // get intensity frpm right image by linear interpolation
          v=0.5f*((1-v)*image2(i, k, channel)+v*image2(i, k, channel));

          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), static_cast<int>(v+0.5f))++;

          n++;
        }
      }
    }

    scale=1.0f/n;
    P*=scale;
  }
  else
  {
    long width=std::min(image1.getWidth(), image2.getWidth());
    long height=std::min(image1.getHeight(), image2.getHeight());

    for (int d=0; d<P.getDepth(); d++)
    {
      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), image2(i, k, channel))++;
        }
      }
    }

    scale=1.0f/(width*height);
    P*=scale;
  }

  // replace all cells with 0 by the smallest value to avoid computing log(0)

  for (long k=0; k<P.getHeight(); k++)
  {
    for (long i=0; i<P.getWidth(); i++)
    {
      if (P(i, k) == 0) P(i, k)=scale;
    }
  }

  // compute joint entropy h_I1,I2 = -Gauss_convolution(log(Gauss_convolution(P_I1,I2)))

  ImageFloat Pg;
  gauss(Pg, P, 1.0f);

  double entropy=0;
  float *pg=Pg.getPtr(0, 0);

  for (long k=0; k<Pg.getHeight(); k++)
  {
    for (long i=0; i<Pg.getWidth(); i++)
    {
      entropy+=negLog(*pg);
      pg++;
    }
  }

  gauss(mi, Pg, 1.0f);

  // sum over columns for getting probabilities of image1

  ImageFloat P1(P.getWidth(), 1, 1);

  for (long i=0; i<P.getWidth(); i++)
  {
    float sum=0;
    for (long k=0; k<P.getHeight(); k++) sum+=P(i, k);
    P1(i, 0)=sum;
  }

  // compute entropy for image1

  GaussKernel gk(1.0f);

  ImageFloat Pg1(P.getWidth(), 1, 1);
  for (long i=0; i<P1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy1=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy1+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to negative mi values

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    float v=gk.convolveHorizontal(Pg1, i, 0, 0);
    for (long k=0; k<P.getHeight(); k++) mi(i, k)=v-mi(i, k);
  }

  // sum over rows for getting probabilities of image1

  P1.setSize(P.getHeight(), 1, 1);

  for (long k=0; k<P.getHeight(); k++)
  {
    float sum=0;
    for (long i=0; i<P.getWidth(); i++) sum+=P(i, k);
    P1(k, 0)=sum;
  }

  // compute entropy for image2

  Pg1.setSize(P.getHeight(), 1, 1);
  for (long i=0; i<Pg1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy2=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy2+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to mi values

  for (long k=0; k<Pg1.getWidth(); k++)
  {
    float v=gk.convolveHorizontal(Pg1, k, 0, 0);
    for (long i=0; i<P.getWidth(); i++) mi(i, k)+=v;
  }

  // apply 1/n

  mi*=scale;

  return static_cast<float>(entropy1+entropy2-entropy);
}